

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassicSudokuVisualizer.cpp
# Opt level: O0

ClassicSudokuVisualizer * __thiscall
ClassicSudokuVisualizer::createStyle_abi_cxx11_(ClassicSudokuVisualizer *this)

{
  undefined1 local_b0 [32];
  undefined1 local_90 [32];
  undefined1 local_70 [32];
  undefined1 local_50 [55];
  undefined1 local_19;
  ClassicSudokuVisualizer *this_local;
  string *style;
  
  local_19 = 0;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",(allocator *)(local_50 + 0x36));
  std::allocator<char>::~allocator((allocator<char> *)(local_50 + 0x36));
  createBorderBottomStyle_abi_cxx11_((ClassicSudokuVisualizer *)local_50);
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::~string((string *)local_50);
  createBorderTopStyle_abi_cxx11_((ClassicSudokuVisualizer *)local_70);
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::~string((string *)local_70);
  createBorderRightStyle_abi_cxx11_((ClassicSudokuVisualizer *)local_90);
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::~string((string *)local_90);
  createBorderLeftStyle_abi_cxx11_((ClassicSudokuVisualizer *)local_b0);
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::~string((string *)local_b0);
  return this;
}

Assistant:

const std::string ClassicSudokuVisualizer::createStyle() {
    std::string style = "";
    style.append(createBorderBottomStyle());
    style.append(createBorderTopStyle());
    style.append(createBorderRightStyle());
    style.append(createBorderLeftStyle());

    return style;
}